

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O2

void EOPLL_RateConv_delete(EOPLL_RateConv *conv)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < conv->ch; lVar1 = lVar1 + 1) {
    free(conv->buf[lVar1]);
  }
  free(conv->buf);
  free(conv->sinc_table);
  free(conv);
  return;
}

Assistant:

void EOPLL_RateConv_delete(EOPLL_RateConv *conv) {
  int i;
  for (i = 0; i < conv->ch; i++) {
    free(conv->buf[i]);
  }
  free(conv->buf);
  free(conv->sinc_table);
  free(conv);
}